

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cc
# Opt level: O0

Symbol avro::parsing::Symbol::error(NodePtr *writer,NodePtr *reader)

{
  ostream *poVar1;
  type pNVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  shared_ptr<avro::Node> *in_RDX;
  any extraout_RDX;
  shared_ptr<avro::Node> *in_RSI;
  Symbol *in_RDI;
  Symbol SVar3;
  ostringstream oss;
  Kind k;
  Symbol *this;
  string local_1c0 [48];
  ostringstream local_190 [376];
  shared_ptr<avro::Node> *local_18;
  shared_ptr<avro::Node> *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Cannot resolve: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_10);
  (*pNVar2->_vptr_Node[0xd])(pNVar2,local_190,0);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::operator<<(poVar1,"with");
  k = (Kind)((ulong)poVar1 >> 0x20);
  std::ostream::operator<<(t,std::endl<char,std::char_traits<char>>);
  pNVar2 = boost::shared_ptr<avro::Node>::operator->(local_18);
  (*pNVar2->_vptr_Node[0xd])(pNVar2,local_190,0);
  std::__cxx11::ostringstream::str();
  Symbol<std::__cxx11::string>(this,k,t);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  SVar3.extra_.content = extraout_RDX.content;
  SVar3._0_8_ = in_RDI;
  return SVar3;
}

Assistant:

Symbol Symbol::error(const NodePtr& writer, const NodePtr& reader)
{
    ostringstream oss;
    oss << "Cannot resolve: " << std::endl;
    writer->printJson(oss, 0);
    oss << std::endl << "with" << std::endl;
    reader->printJson(oss, 0);
    return Symbol(sError, oss.str());
}